

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Client::show_client_details(Client *this)

{
  ostream *poVar1;
  char *pcVar2;
  string client_gender;
  allocator local_31;
  string local_30 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nClient name: ");
  std::operator<<(poVar1,this->name);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nBirthdate: ");
  std::operator<<(poVar1,this->bdate);
  pcVar2 = "female";
  if (this->gender == false) {
    pcVar2 = "male";
  }
  std::__cxx11::string::string(local_30,pcVar2,&local_31);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nGender: ");
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Client::show_client_details() {
    std::cout<<"\nClient name: "<<name;
    std::cout<<"\nBirthdate: " << bdate;
    std::string client_gender = (gender==0) ? "male": "female";
    std::cout<<"\nGender: "<<client_gender;

}